

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_posix.c
# Opt level: O3

int mutex_lock_shared(mutex_handle *mutex)

{
  pthread_mutex_t *__mutex;
  int *piVar1;
  void *pvVar2;
  int iVar3;
  
  pvVar2 = mutex->priv;
  __mutex = (pthread_mutex_t *)((long)pvVar2 + 0x30);
  iVar3 = pthread_mutex_lock(__mutex);
  if (iVar3 == 0) {
    piVar1 = (int *)((long)pvVar2 + 0x58);
    *piVar1 = *piVar1 + 1;
    iVar3 = pthread_mutex_unlock(__mutex);
  }
  return -iVar3;
}

Assistant:

int mutex_lock_shared(struct mutex_handle *mutex)
{
	struct mutex_priv *priv = mutex->priv;
	int ret;

	ret = pthread_mutex_lock(&priv->lock);
	if (ret != 0)
		return -ret;

	priv->readers++;

	return -pthread_mutex_unlock(&priv->lock);
}